

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

SamplerType glu::TextureTestUtil::getSamplerType(TextureFormat format)

{
  SamplerType SVar1;
  ulong uVar2;
  
  uVar2 = (ulong)format >> 0x20;
  if (UNSIGNED_INT32 < format.type) {
    return SAMPLERTYPE_FLOAT;
  }
  if ((0x38000000UL >> (uVar2 & 0x3f) & 1) == 0) {
    if ((0x240200000U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x82000000UL >> (uVar2 & 0x3f) & 1) == 0) {
        return SAMPLERTYPE_FLOAT;
      }
      return (uint)((format.order - D & 0xfffffffd) != 0) * 2;
    }
    SVar1 = SAMPLERTYPE_UINT;
  }
  else {
    SVar1 = SAMPLERTYPE_INT;
  }
  return SVar1;
}

Assistant:

SamplerType getSamplerType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return SAMPLERTYPE_INT;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return SAMPLERTYPE_UINT;

		// Texture formats used in depth/stencil textures.
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT_24_8:
			return (format.order == TextureFormat::D || format.order == TextureFormat::DS) ? SAMPLERTYPE_FLOAT : SAMPLERTYPE_UINT;

		default:
			return SAMPLERTYPE_FLOAT;
	}
}